

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_file_puts(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  undefined1 auVar1 [16];
  size_t in_RAX;
  FILE *__s;
  char *ptr;
  ulong uVar2;
  long lVar3;
  JSValue val1;
  size_t len;
  size_t local_38;
  
  __s = _stdout;
  local_38 = in_RAX;
  if ((magic == 0) || (__s = (FILE *)js_std_file_get(ctx,this_val), __s != (FILE *)0x0)) {
    uVar2 = 3;
    if (0 < argc) {
      lVar3 = 0;
      do {
        val1.tag = *(int64_t *)((long)&argv->tag + lVar3);
        val1.u.ptr = ((JSValueUnion *)((long)&argv->u + lVar3))->ptr;
        ptr = JS_ToCStringLen2(ctx,&local_38,val1,0);
        if (ptr == (char *)0x0) goto LAB_00110a67;
        fwrite(ptr,1,local_38,__s);
        JS_FreeCString(ctx,ptr);
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)argc << 4 != lVar3);
      uVar2 = 3;
    }
  }
  else {
LAB_00110a67:
    uVar2 = 6;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (JSValue)(auVar1 << 0x40);
}

Assistant:

static JSValue js_std_file_puts(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int magic)
{
    FILE *f;
    int i;
    const char *str;
    size_t len;

    if (magic == 0) {
        f = stdout;
    } else {
        f = js_std_file_get(ctx, this_val);
        if (!f)
            return JS_EXCEPTION;
    }
    
    for(i = 0; i < argc; i++) {
        str = JS_ToCStringLen(ctx, &len, argv[i]);
        if (!str)
            return JS_EXCEPTION;
        fwrite(str, 1, len, f);
        JS_FreeCString(ctx, str);
    }
    return JS_UNDEFINED;
}